

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

AddressClassification __thiscall QHostAddressPrivate::classify(QHostAddressPrivate *this)

{
  uint uVar1;
  uint uVar2;
  unsigned_long_long uVar3;
  long in_RDI;
  quint64 low64;
  quint32 high16;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x30) == 0) {
    if (*(long *)(in_RDI + 0x20) == 0) {
      uVar3 = qFromBigEndian<unsigned_long_long>(0x2164e0);
      if (uVar3 == 1) {
        local_4 = LoopbackAddress;
      }
      else if (uVar3 >> 0x20 == 0xffff) {
        local_4 = LocalNetAddress;
      }
      else if (uVar3 == 0) {
        if (*(char *)(in_RDI + 0x34) == -1) {
          local_4 = UnknownAddress;
        }
        else {
          local_4 = LocalNetAddress;
        }
      }
      else {
        local_4 = GlobalAddress;
      }
    }
    else {
      uVar1 = qFromBigEndian<unsigned_int>(0);
      uVar2 = uVar1 >> 0x18;
      if (uVar2 - 0xfc < 2) {
        local_4 = UniqueLocalAddress;
      }
      else if (uVar2 == 0xfe) {
        uVar1 = uVar1 >> 0x10 & 0xffc0;
        if (uVar1 == 0xfe80) {
          local_4 = LinkLocalAddress;
        }
        else if (uVar1 == 0xfec0) {
          local_4 = SiteLocalAddress;
        }
        else {
          local_4 = UnknownAddress;
        }
      }
      else if (uVar2 == 0xff) {
        local_4 = MulticastAddress;
      }
      else {
        local_4 = GlobalAddress;
      }
    }
  }
  else if ((*(uint *)(in_RDI + 0x30) & 0xff000000) == 0x7f000000) {
    local_4 = LoopbackAddress;
  }
  else if ((*(uint *)(in_RDI + 0x30) & 0xf0000000) == 0xe0000000) {
    local_4 = MulticastAddress;
  }
  else if ((*(uint *)(in_RDI + 0x30) & 0xffff0000) == 0xa9fe0000) {
    local_4 = LinkLocalAddress;
  }
  else if ((*(uint *)(in_RDI + 0x30) & 0xff000000) == 0) {
    local_4 = LocalNetAddress;
  }
  else if ((*(uint *)(in_RDI + 0x30) & 0xf0000000) == 0xf0000000) {
    if (*(int *)(in_RDI + 0x30) == -1) {
      local_4 = BroadcastAddress;
    }
    else {
      local_4 = UnknownAddress;
    }
  }
  else if ((((*(uint *)(in_RDI + 0x30) & 0xff000000) == 0xa000000) ||
           ((*(uint *)(in_RDI + 0x30) & 0xfff00000) == 0xac100000)) ||
          ((*(uint *)(in_RDI + 0x30) & 0xffff0000) == 0xc0a80000)) {
    local_4 = PrivateNetworkAddress;
  }
  else {
    local_4 = GlobalAddress;
  }
  return local_4;
}

Assistant:

AddressClassification QHostAddressPrivate::classify() const
{
    if (a) {
        // This is an IPv4 address or an IPv6 v4-mapped address includes all
        // IPv6 v4-compat addresses, except for ::ffff:0.0.0.0 (because `a' is
        // zero). See setAddress(quint8*) below, which calls convertToIpv4(),
        // for details.
        // Source: RFC 5735
        if ((a & 0xff000000U) == 0x7f000000U)   // 127.0.0.0/8
            return LoopbackAddress;
        if ((a & 0xf0000000U) == 0xe0000000U)   // 224.0.0.0/4
            return MulticastAddress;
        if ((a & 0xffff0000U) == 0xa9fe0000U)   // 169.254.0.0/16
            return LinkLocalAddress;
        if ((a & 0xff000000U) == 0)             // 0.0.0.0/8 except 0.0.0.0 (handled below)
            return LocalNetAddress;
        if ((a & 0xf0000000U) == 0xf0000000U) { // 240.0.0.0/4
            if (a == 0xffffffffU)               // 255.255.255.255
                return BroadcastAddress;
            return UnknownAddress;
        }
        if (((a & 0xff000000U) == 0x0a000000U)      // 10.0.0.0/8
            || ((a & 0xfff00000U) == 0xac100000U)   // 172.16.0.0/12
            || ((a & 0xffff0000U) == 0xc0a80000U))  // 192.168.0.0/16
            return PrivateNetworkAddress;

        // Not testing for TestNetworkAddress
        // since we don't need them yet.
        return GlobalAddress;
    }

    // As `a' is zero, this address is either ::ffff:0.0.0.0 or a non-v4-mapped IPv6 address.
    // Source: https://www.iana.org/assignments/ipv6-address-space/ipv6-address-space.xhtml
    if (a6_64.c[0]) {
        quint32 high16 = qFromBigEndian(a6_32.c[0]) >> 16;
        switch (high16 >> 8) {
        case 0xff:                          // ff00::/8
            return MulticastAddress;
        case 0xfe:
            switch (high16 & 0xffc0) {
            case 0xfec0:                    // fec0::/10
                return SiteLocalAddress;

            case 0xfe80:                    // fe80::/10
                return LinkLocalAddress;

            default:                        // fe00::/9
                return UnknownAddress;
            }
        case 0xfd:                          // fc00::/7
        case 0xfc:
            return UniqueLocalAddress;
        default:
            return GlobalAddress;
        }
    }

    quint64 low64 = qFromBigEndian(a6_64.c[1]);
    if (low64 == 1)                             // ::1
        return LoopbackAddress;
    if (low64 >> 32 == 0xffff) {                // ::ffff:0.0.0.0/96
        Q_ASSERT(quint32(low64) == 0);
        return LocalNetAddress;
    }
    if (low64)                                  // not ::
        return GlobalAddress;

    if (protocol == QHostAddress::UnknownNetworkLayerProtocol)
        return UnknownAddress;

    // only :: and 0.0.0.0 remain now
    return LocalNetAddress;
}